

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O1

void __thiscall
kratos::DeadCodeVarElimination::visit(DeadCodeVarElimination *this,Generator *generator)

{
  pointer pbVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  pointer pbVar3;
  int iVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  Var *local_48;
  pointer local_40;
  uint local_34;
  
  do {
    Generator::get_vars_abi_cxx11_(&local_60,generator);
    pbVar1 = local_60.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_60.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_60.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_60);
      break;
    }
    local_34 = 0;
    pbVar3 = local_60.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      Generator::get_var((Generator *)&stack0xffffffffffffffb8,(string *)generator);
      iVar4 = 5;
      if (local_48->type_ == Base) {
        iVar2 = (*(local_48->super_IRNode)._vptr_IRNode[0xe])();
        iVar4 = 0;
        if (*(long *)(CONCAT44(extraout_var,iVar2) + 0x18) == 0) {
          remove_var(local_48);
          local_34 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          iVar4 = 4;
        }
      }
      if (local_40 != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40);
      }
    } while (((iVar4 == 5) || (iVar4 == 0)) && (pbVar3 = pbVar3 + 1, pbVar3 != pbVar1));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60);
  } while ((local_34 & 1) != 0);
  clear_out_ports(generator);
  return;
}

Assistant:

void visit(Generator* generator) override {
        bool changed = true;

        while (changed) {
            changed = false;
            const auto& var_names = generator->get_vars();
            for (auto const& var_name : var_names) {
                auto const& var = generator->get_var(var_name);
                if (var->type() != VarType::Base) continue;
                if (var->sinks().empty()) {
                    // remove all the sources
                    remove_var(var.get());
                    changed = true;
                    break;
                }
            }
        }

        // because we run child first, the parent's content get cleared out
        // nicely before this pass runs on parent
        clear_out_ports(generator);
    }